

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O2

int VHTightenHull(ImVec2 *hull,int n,double threshold)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  uVar6 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    uVar7 = (long)((int)uVar6 + 1) % (long)n & 0xffffffff;
    dVar8 = VHAngleToX(hull[uVar6],hull[uVar7]);
    dVar9 = VHAngleToX(hull[uVar7],hull[(long)((int)uVar6 + 2) % (long)n & 0xffffffff]);
    if ((double)(~-(ulong)(dVar9 < dVar8) & (ulong)(dVar9 - dVar8) |
                (ulong)(dVar8 - dVar9) & -(ulong)(dVar9 < dVar8)) < threshold) {
      hull[uVar7] = hull[uVar6];
    }
  }
  lVar2 = 0;
  lVar5 = 0;
  do {
    iVar4 = (int)lVar5;
    lVar1 = (long)iVar4;
    while( true ) {
      lVar5 = lVar1;
      iVar4 = iVar4 + 1;
      if (n <= lVar5) {
        return (int)lVar2;
      }
      if ((hull[lVar5].x != hull[iVar4 % n].x) || (NAN(hull[lVar5].x) || NAN(hull[iVar4 % n].x)))
      break;
      if ((hull[lVar5].y != hull[iVar4 % n].y) ||
         (lVar1 = lVar5 + 1, NAN(hull[lVar5].y) || NAN(hull[iVar4 % n].y))) break;
    }
    hull[lVar2] = hull[lVar5];
    lVar2 = lVar2 + 1;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int VHTightenHull(ImVec2 hull[], int n, double threshold) {
	// theory: circle the hull, compare 3 points at a time, if the mid point is
	// sub-angular then make it equal the first point and move to the 3rd.
	int i, ni;
	ImVec2 *a, *b, *c;
	double a1, a2, ad;
	// First cycle, we look for sub-threshold 2-segment runs
	for (i = 0; i < n; i++) {
		a = &(hull[i]);
		b = &(hull[(i + 1) % n]);
		c = &(hull[(i + 2) % n]);

		a1 = VHAngleToX(*a, *b);
		a2 = VHAngleToX(*b, *c);
		if (a1 > a2)
			ad = a1 - a2;
		else
			ad = a2 - a1;

		if (ad < threshold) {
			//			fprintf(stderr,"angle below threshold
			//(%0.2f)\n", ad);
			*b = *a;
		}
	} // end first cycle

	// Second cycle, we compact the hull
	int output_index = 0;
	i                = 0;
	while (i < n) {
		ni = (i + 1) % n;
		if ((hull[i].x == hull[ni].x) && (hull[i].y == hull[ni].y)) {
			// match found, discard one
			i++;
			continue;
		}

		hull[output_index] = hull[i];
		output_index++;
		i++;
	}

	return output_index;
}